

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O2

void Cmd_HistoryAddCommand(Abc_Frame_t *p,char *command)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *__s1;
  ulong uVar5;
  ulong uVar6;
  Vec_Ptr_t *p_00;
  uint uVar7;
  undefined4 local_803c;
  char Buffer [32768];
  
  if (p->fBatchMode == 0) {
    sVar4 = strlen(command);
    strcpy(Buffer,command);
    if ((0 < (int)sVar4) && (uVar7 = (int)sVar4 - 1, Buffer[uVar7] == '\n')) {
      Buffer[uVar7] = '\0';
    }
    sVar4 = strlen(Buffer);
    if (((((3 < sVar4) && (iVar2 = bcmp(Buffer,"set",3), iVar2 != 0)) &&
         (iVar2 = bcmp(Buffer,"unset",5), iVar2 != 0)) &&
        ((Buffer._0_4_ != 0x656d6974 && (Buffer._0_4_ != 0x74697571)))) &&
       ((iVar2 = bcmp(Buffer,"alias",5), iVar2 != 0 &&
        ((iVar2 = bcmp(Buffer,"history",7), iVar2 != 0 && (iVar2 = bcmp(Buffer,"hi ",3), iVar2 != 0)
         ))))) {
      iVar2 = bcmp(Buffer,"hi",3);
      if ((iVar2 != 0) && (Buffer[sVar4 - 1] != '?')) {
        p_00 = p->aHistory;
        uVar7 = p_00->nSize;
        local_803c = 10;
        if (10 < (int)uVar7) {
          local_803c = uVar7;
        }
        local_803c = local_803c - 10;
        uVar6 = (ulong)local_803c;
        if ((int)local_803c < (int)uVar7) {
          local_803c = uVar7;
        }
        __s1 = (char *)0x0;
        for (; uVar3 = local_803c, (long)uVar6 < (long)(int)uVar7; uVar6 = uVar6 + 1) {
          __s1 = (char *)p_00->pArray[uVar6];
          iVar2 = strcmp(__s1,Buffer);
          if (iVar2 == 0) {
            uVar3 = (uint)uVar6;
            break;
          }
        }
        if (uVar3 == uVar7) {
          __s1 = Extra_UtilStrsav(Buffer);
        }
        else {
          uVar6 = (ulong)uVar7;
          do {
            if ((int)uVar6 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            uVar5 = uVar6 - 1;
            lVar1 = uVar6 - 1;
            uVar6 = uVar5;
          } while ((char *)p_00->pArray[lVar1] != __s1);
          while (uVar6 = uVar5 + 1, (int)uVar6 < (int)uVar7) {
            p_00->pArray[uVar5] = p_00->pArray[uVar6];
            uVar5 = uVar6;
          }
          p_00->nSize = uVar7 - 1;
          p_00 = p->aHistory;
        }
        Vec_PtrPush(p_00,__s1);
      }
    }
  }
  return;
}

Assistant:

void Cmd_HistoryAddCommand(    Abc_Frame_t * p, const char * command )
{
    int nLastLooked =   10;  // do not add history if the same entry appears among the last entries
    int nLastSaved  = 1000;  // when saving a file, save no more than this number of last entries
    char Buffer[ABC_MAX_STR];
    int Len;
    if ( p->fBatchMode )
        return;
    Len = strlen(command);
    strcpy( Buffer, command );
    if ( Len > 0 && Buffer[Len-1] == '\n' )
        Buffer[Len-1] = 0;
    if ( strlen(Buffer) > 3 &&
         strncmp(Buffer,"set",3) && 
         strncmp(Buffer,"unset",5) && 
         strncmp(Buffer,"time",4) && 
         strncmp(Buffer,"quit",4) && 
         strncmp(Buffer,"alias",5) && 
//         strncmp(Buffer,"source",6) && 
         strncmp(Buffer,"history",7) && strncmp(Buffer,"hi ", 3) && strcmp(Buffer,"hi") &&
         Buffer[strlen(Buffer)-1] != '?' )
    {
        char * pStr = NULL;
        int i, Start = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory) - nLastLooked );
        // do not enter if the same command appears among nLastLooked commands
        Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Start )
            if ( !strcmp(pStr, Buffer) )
                break;
        if ( i == Vec_PtrSize(p->aHistory) )
        { // add new entry
            Vec_PtrPush( p->aHistory, Extra_UtilStrsav(Buffer) );
            Cmd_HistoryWrite( p, nLastSaved );
        }
        else
        { // put at the end
            Vec_PtrRemove( p->aHistory, pStr );
            Vec_PtrPush( p->aHistory, pStr );
        }
    }
}